

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O2

void __thiscall Js::StackScriptFunction::BoxState::Finish(BoxState *this)

{
  Type *pTVar1;
  uint uVar2;
  int iVar3;
  Type piVar4;
  Type pSVar5;
  ulong uVar6;
  int iVar7;
  
  uVar2 = (this->frameToBox).
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .bucketCount;
  piVar4 = (this->frameToBox).
           super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           .buckets;
  for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    iVar7 = piVar4[uVar6];
    if (iVar7 != -1) {
      pSVar5 = (this->frameToBox).
               super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               .entries;
      while (iVar7 != -1) {
        iVar3 = pSVar5[iVar7].
                super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
                super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::FunctionBody_*>_>
                .super_ValueEntryData<Js::FunctionBody_*>.next;
        pTVar1 = &((pSVar5[iVar7].
                    super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                    .super_ImplicitKeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
                    super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::FunctionBody_*>_>
                    .super_ValueEntryData<Js::FunctionBody_*>.value)->super_ParseableFunctionInfo).
                  flags;
        *pTVar1 = *pTVar1 & (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|
                             Flags_HasOnlyThisStatements|Flags_NonUserCode|Flags_HasThis|
                             Flags_HasTry|Flags_HasOrParentHasArguments);
        iVar7 = iVar3;
      }
    }
  }
  return;
}

Assistant:

void StackScriptFunction::BoxState::Finish()
    {
        frameToBox.Map([](FunctionBody * body)
        {
            body->SetStackNestedFunc(false);
        });
    }